

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNKalm.cpp
# Opt level: O3

void __thiscall
NaPNKalman::set_ss_equations(NaPNKalman *this,NaMatrix *mA,NaMatrix *mB,NaMatrix *mC)

{
  int iVar1;
  int iVar2;
  undefined4 *puVar3;
  
  iVar1 = (*mA->_vptr_NaMatrix[7])(mA);
  if (iVar1 != 0) {
    iVar1 = (*mA->_vptr_NaMatrix[6])(mA);
    if (iVar1 != 0) {
      iVar1 = (*mB->_vptr_NaMatrix[7])(mB);
      if (iVar1 != 0) {
        iVar1 = (*mB->_vptr_NaMatrix[6])(mB);
        if (iVar1 != 0) {
          iVar1 = (*mC->_vptr_NaMatrix[7])(mC);
          if (iVar1 != 0) {
            iVar1 = (*mC->_vptr_NaMatrix[6])(mC);
            if (iVar1 != 0) {
              iVar1 = (*mA->_vptr_NaMatrix[6])(mA);
              iVar2 = (*mB->_vptr_NaMatrix[6])(mB);
              if (iVar1 == iVar2) {
                iVar1 = (*mA->_vptr_NaMatrix[6])(mA);
                iVar2 = (*mC->_vptr_NaMatrix[7])(mC);
                if (iVar1 == iVar2) {
                  NaMatrix::operator=(&this->A,mA);
                  NaMatrix::operator=(&this->B,mB);
                  NaMatrix::operator=(&this->C,mC);
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 2;
  __cxa_throw(puVar3,&NaException::typeinfo,0);
}

Assistant:

void
NaPNKalman::set_ss_equations (const NaMatrix& mA,
                              const NaMatrix& mB,
                              const NaMatrix& mC)
{
    if(!(mA.dim_cols() > 0 && mA.dim_rows() > 0 &&
         mB.dim_cols() > 0 && mB.dim_rows() > 0 &&
         mC.dim_cols() > 0 && mC.dim_rows() > 0 &&
         mA.dim_rows() == mB.dim_rows() &&
         mA.dim_rows() == mC.dim_cols())){
         throw(na_size_mismatch);
    }

    A = mA;
    B = mB;
    C = mC;
}